

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UBool uhash_compareUnicodeString_63(UElement key1,UElement key2)

{
  UnicodeString *str2;
  UnicodeString *str1;
  UElement key2_local;
  UElement key1_local;
  
  if (key1.pointer == key2.pointer) {
    key1_local._7_1_ = 1;
  }
  else if ((key1.pointer == (void *)0x0) || (key2.pointer == (void *)0x0)) {
    key1_local._7_1_ = 0;
  }
  else {
    key1_local._7_1_ =
         icu_63::UnicodeString::operator==
                   ((UnicodeString *)key1.pointer,(UnicodeString *)key2.pointer);
  }
  return key1_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
uhash_compareUnicodeString(const UElement key1, const UElement key2) {
    const UnicodeString *str1 = (const UnicodeString*) key1.pointer;
    const UnicodeString *str2 = (const UnicodeString*) key2.pointer;
    if (str1 == str2) {
        return TRUE;
    }
    if (str1 == NULL || str2 == NULL) {
        return FALSE;
    }
    return *str1 == *str2;
}